

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTPNOr::gen_code(CTPNOr *this,int discard,int for_condition)

{
  CTcPrsNode *pCVar1;
  int iVar2;
  CTcCodeLabel *lbl;
  
  pCVar1 = (this->super_CTPNOrBase).super_CTPNBin.super_CTPNBinBase.left_;
  (**(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar1,0,1);
  lbl = CTcPrsNode::gen_jump_ahead((discard == 0) * '\b' + 0x92);
  pCVar1 = (this->super_CTPNOrBase).super_CTPNBin.super_CTPNBinBase.right_;
  (**(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar1,(ulong)(uint)discard,1);
  G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  CTcPrsNode::def_label_pos(lbl);
  if (for_condition != 0) {
    return;
  }
  iVar2 = (*(((this->super_CTPNOrBase).super_CTPNBin.super_CTPNBinBase.left_)->super_CTcPrsNodeBase)
            ._vptr_CTcPrsNodeBase[2])();
  if ((iVar2 != 0) &&
     (iVar2 = (*(((this->super_CTPNOrBase).super_CTPNBin.super_CTPNBinBase.right_)->
                super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[2])(), iVar2 != 0)) {
    return;
  }
  CTcGenTarg::write_op(G_cg,'-');
  return;
}

Assistant:

void CTPNOr::gen_code(int discard, int for_condition)
{
    CTcCodeLabel *lbl;
    
    /* 
     *   First, evaluate the left-hand side; we need the result even if
     *   we're discarding the overall expression, since we will check the
     *   result to see if we should even evaluate the right-hand side.
     *   We're using the value for a condition, so don't bother
     *   boolean-izing it.  
     */
    left_->gen_code(FALSE, TRUE);

    /* 
     *   If the left-hand side is true, there's no need to evaluate the
     *   right-hand side (and, in fact, we're not even allowed to evaluate
     *   the right-hand side because of the short-circuit logic rule).
     *   So, if the lhs is true, we want to jump around the code to
     *   evaluate the rhs, saving the 'true' result if we're not
     *   discarding the overall result. 
     */
    lbl = gen_jump_ahead(discard ? OPC_JT : OPC_JST);

    /* 
     *   Evaluate the right-hand side.  We don't need to save the result
     *   unless we need the result of the overall expression.  Generate
     *   the value as though we were going to booleanize it ourselves,
     *   since we'll do just that (hence pass for_condition = TRUE).  
     */
    right_->gen_code(discard, TRUE); 

    /*
     *   If we discarded the result, we generated a JT which explicitly
     *   popped a value.  If we didn't discard the result, we generated a
     *   JST; this may or may not pop the value.  However, if it doesn't
     *   pop the value (save on true), it will bypass the right side
     *   evaluation, and will thus "pop" that value in the sense that it
     *   will never be pushed.  So, note a pop either way.  
     */
    G_cg->note_pop();

    /* define the label for the jump over the rhs */
    def_label_pos(lbl);

    /* 
     *   If the result is not going to be used directly for a condition, we
     *   must boolean-ize the value.  This isn't necessary if both of the
     *   operands are already guaranteed to be boolean values.  
     */
    if (!for_condition && !(left_->is_bool() && right_->is_bool()))
        G_cg->write_op(OPC_BOOLIZE);
}